

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O3

void __thiscall trieste::PassDef::compile_rules(PassDef *this)

{
  _Base_ptr p_Var1;
  pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
  *ppVar2;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *this_00;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *this_01;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>_>
  *this_02;
  pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
  *rule;
  anon_class_8_1_899143fa f;
  anon_class_16_2_a97d8124 f_00;
  
  this_02 = &this->rule_map;
  detail::
  DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>_>
  ::clear(this_02);
  ppVar2 = (this->rules_).
           super__Vector_base<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (f.rule = (this->rules_).
                super__Vector_base<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; f.rule != ppVar2; f.rule = f.rule + 1) {
    if (*(size_t *)
         ((long)&((f.rule)->first).value.fast_pattern.parents._M_t._M_impl.super__Rb_tree_header +
         0x20) == 0) {
      f_00.rule = f.rule;
      f_00.starts = &((f.rule)->first).value.fast_pattern.starts;
      detail::
      DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>,std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>>>>>
      ::
      modify_all<trieste::PassDef::compile_rules()::_lambda(trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>,std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>>>>&)_1_>
                ((DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>,std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>>>>>
                  *)this_02,f_00);
    }
    else {
      p_Var4 = *(_Base_ptr *)
                ((long)&((f.rule)->first).value.fast_pattern.parents._M_t._M_impl.
                        super__Rb_tree_header + 0x10);
      p_Var1 = &((f.rule)->first).value.fast_pattern.parents._M_t._M_impl.super__Rb_tree_header.
                _M_header;
      if (p_Var4 != p_Var1) {
        do {
          this_00 = detail::
                    DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>_>
                    ::modify(this_02,(Token *)(p_Var4 + 1));
          if (*(size_t *)
               ((long)&((f.rule)->first).value.fast_pattern.starts._M_t._M_impl.
                       super__Rb_tree_header + 0x20) == 0) {
            detail::
            DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>,std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>>>>
            ::operator()((DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>,std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>>>>
                          *)this_00,f);
          }
          else {
            for (p_Var3 = *(_Base_ptr *)
                           ((long)&((f.rule)->first).value.fast_pattern.starts._M_t._M_impl.
                                   super__Rb_tree_header + 0x10);
                p_Var3 != &((f.rule)->first).value.fast_pattern.starts._M_t._M_impl.
                           super__Rb_tree_header._M_header;
                p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
              this_01 = detail::
                        DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                        ::modify(this_00,(Token *)(p_Var3 + 1));
              std::
              vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
              ::push_back(this_01,f.rule);
            }
          }
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        } while (p_Var4 != p_Var1);
      }
    }
  }
  return;
}

Assistant:

void compile_rules()
    {
      rule_map.clear();

      for (auto& rule : rules_)
      {
        const auto& starts = rule.first.value.get_starts();
        const auto& parents = rule.first.value.get_parents();

        //  This is used to add a rule under a specific parent, or to the
        //  default.
        auto add = [&](detail::DefaultMap<
                       std::vector<detail::PatternEffect<Node>>>& rules) {
          if (starts.empty())
          {
            // If there are no starts, then this rule applies to all tokens.
            rules.modify_all([&](std::vector<detail::PatternEffect<Node>>& v) {
              v.push_back(rule);
            });
          }
          else
          {
            for (const auto& start : starts)
            {
              // Add the rule to the specific start token.
              rules.modify(start).push_back(rule);
            }
          }
        };

        if (parents.empty())
        {
          rule_map.modify_all(add);
        }
        else
        {
          for (const auto& parent : parents)
          {
            add(rule_map.modify(parent));
          }
        }
      }
    }